

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineState.h
# Opt level: O0

void __thiscall
Diligent::GraphicsPipelineStateCreateInfo::GraphicsPipelineStateCreateInfo
          (GraphicsPipelineStateCreateInfo *this)

{
  GraphicsPipelineStateCreateInfo *this_local;
  
  PipelineStateCreateInfo::PipelineStateCreateInfo(&this->super_PipelineStateCreateInfo);
  GraphicsPipelineDesc::GraphicsPipelineDesc(&this->GraphicsPipeline);
  this->pVS = (IShader *)0x0;
  this->pPS = (IShader *)0x0;
  this->pDS = (IShader *)0x0;
  this->pHS = (IShader *)0x0;
  this->pGS = (IShader *)0x0;
  this->pAS = (IShader *)0x0;
  this->pMS = (IShader *)0x0;
  (this->super_PipelineStateCreateInfo).PSODesc.PipelineType = PIPELINE_TYPE_GRAPHICS;
  return;
}

Assistant:

constexpr GraphicsPipelineStateCreateInfo() noexcept 
    {
        PSODesc.PipelineType = PIPELINE_TYPE_GRAPHICS;
    }